

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O0

Reader * __thiscall
capnproto_test::capnp::test::TestDefaults::Reader::getUInt64List
          (Reader *__return_storage_ptr__,Reader *this)

{
  PointerReader reader;
  uint ptrIndex;
  PointerReader local_30;
  Reader *local_10;
  Reader *this_local;
  
  local_10 = this;
  ptrIndex = ::capnp::bounded<12u>();
  ::capnp::_::StructReader::getPointerField(&local_30,&this->_reader,ptrIndex);
  reader.capTable = local_30.capTable;
  reader.segment = local_30.segment;
  reader.pointer = local_30.pointer;
  reader.nestingLimit = local_30.nestingLimit;
  reader._28_4_ = local_30._28_4_;
  ::capnp::_::PointerHelpers<capnp::List<unsigned_long,_(capnp::Kind)0>,_(capnp::Kind)6>::get
            (__return_storage_ptr__,reader,(word *)&DAT_00a14560);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::List< ::uint64_t,  ::capnp::Kind::PRIMITIVE>::Reader TestDefaults::Reader::getUInt64List() const {
  return ::capnp::_::PointerHelpers< ::capnp::List< ::uint64_t,  ::capnp::Kind::PRIMITIVE>>::get(_reader.getPointerField(
      ::capnp::bounded<12>() * ::capnp::POINTERS),
        ::capnp::schemas::bp_eb3f9ebe98c73cb6 + 757);
}